

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_7::Validator::Validator
          (Validator *this,Errors *errors,Script *script,ValidateOptions *options)

{
  anon_class_8_1_8991fb9c local_60;
  ErrorCallback local_58;
  ValidateOptions *local_28;
  ValidateOptions *options_local;
  Script *script_local;
  Errors *errors_local;
  Validator *this_local;
  
  local_28 = options;
  options_local = (ValidateOptions *)script;
  script_local = (Script *)errors;
  errors_local = (Errors *)this;
  ExprVisitor::Delegate::Delegate(&this->super_Delegate);
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR__Validator_01e55a20;
  this->options_ = local_28;
  this->errors_ = (Errors *)script_local;
  this->script_ = (Script *)options_local;
  this->current_module_ = (Module *)0x0;
  this->current_func_ = (Func *)0x0;
  this->current_table_index_ = 0;
  this->current_memory_index_ = 0;
  this->current_global_index_ = 0;
  this->num_imported_globals_ = 0;
  this->current_except_index_ = 0;
  TypeChecker::TypeChecker(&this->typechecker_);
  this->expr_loc_ = (Location *)0x0;
  Result::Result(&this->result_,Ok);
  local_60.this = this;
  std::function<void(char_const*)>::
  function<wabt::(anonymous_namespace)::Validator::Validator(std::vector<wabt::Error,std::allocator<wabt::Error>>*,wabt::Script_const*,wabt::ValidateOptions_const&)::__0,void>
            ((function<void(char_const*)> *)&local_58,&local_60);
  TypeChecker::set_error_callback(&this->typechecker_,&local_58);
  std::function<void_(const_char_*)>::~function(&local_58);
  return;
}

Assistant:

Validator::Validator(Errors* errors,
                     const Script* script,
                     const ValidateOptions& options)
    : options_(options), errors_(errors), script_(script) {
  typechecker_.set_error_callback(
      [this](const char* msg) { OnTypecheckerError(msg); });
}